

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O3

unsigned_long cmsys::Directory::GetNumberOfFilesInDirectory(string *name,string *errorMessage)

{
  int *piVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *__s;
  int __errnum;
  unsigned_long uVar3;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    if (errorMessage == (string *)0x0) {
      return 0;
    }
    __errnum = *piVar1;
  }
  else {
    pdVar2 = readdir(__dirp);
    uVar3 = 0;
    while (pdVar2 != (dirent *)0x0) {
      uVar3 = uVar3 + 1;
      pdVar2 = readdir(__dirp);
    }
    __errnum = *piVar1;
    if (__errnum == 0) {
      closedir(__dirp);
      return uVar3;
    }
    if (errorMessage == (string *)0x0) {
      return 0;
    }
  }
  __s = strerror(__errnum);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
  std::__cxx11::string::operator=((string *)errorMessage,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return 0;
}

Assistant:

unsigned long Directory::GetNumberOfFilesInDirectory(const std::string& name,
                                                     std::string* errorMessage)
{
  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return 0;
  }

  unsigned long count = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    count++;
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return false;
  }

  closedir(dir);
  return count;
}